

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  ImGuiID *pIVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ImGuiTableColumn *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ImGuiContext *pIVar29;
  ImGuiID *pIVar30;
  ImGuiID *pIVar31;
  ImGuiTableColumnIdx *pIVar32;
  byte bVar33;
  ImGuiContext *g;
  long lVar34;
  char cVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  byte *pbVar39;
  ulong uVar40;
  bool bVar41;
  uint uVar42;
  int iVar53;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar54;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar75;
  undefined1 auVar73 [16];
  int iVar76;
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int iVar90;
  int iVar94;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  long lVar56;
  
  pIVar29 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x10) == 0) {
    lVar37 = (long)table->SettingsOffset;
    if (lVar37 == -1) {
      pIVar30 = (ImGuiID *)(pIVar29->SettingsTables).Buf.Data;
      pIVar1 = pIVar30 + 1;
      if (pIVar30 != (ImGuiID *)0x0) {
        pIVar31 = pIVar1;
        do {
          pIVar30 = pIVar31;
          if (*pIVar30 == table->ID) break;
          pIVar31 = (ImGuiID *)((long)(int)pIVar30[-1] + (long)pIVar30);
          pIVar30 = (ImGuiID *)0x0;
        } while (pIVar31 != (ImGuiID *)((long)(pIVar29->SettingsTables).Buf.Size + (long)pIVar1));
      }
      if (pIVar30 == (ImGuiID *)0x0) {
        return;
      }
      if (table->ColumnsCount != (int)(char)pIVar30[3]) {
        table->IsSettingsDirty = true;
      }
      table->SettingsOffset = (int)pIVar30 - *(int *)&(pIVar29->SettingsTables).Buf.Data;
    }
    else {
      pcVar4 = (pIVar29->SettingsTables).Buf.Data;
      pIVar30 = (ImGuiID *)(pcVar4 + lVar37);
      if ((int)pcVar4[lVar37 + 0xd] < table->ColumnsCount) {
        *pIVar30 = 0;
        pIVar30 = (ImGuiID *)0x0;
      }
    }
    table->SettingsLoadedFlags = pIVar30[1];
    table->RefScale = (float)pIVar30[2];
    bVar33 = (byte)pIVar30[3];
    uVar36 = 0;
    if ((char)bVar33 < '\x01') {
      uVar38 = 0;
    }
    else {
      pbVar39 = (byte *)((long)pIVar30 + 0x1b);
      uVar38 = 0;
      do {
        uVar42 = (uint)(char)pbVar39[-3];
        uVar40 = (ulong)uVar42;
        if ((-1 < (int)uVar42) && ((int)uVar42 < table->ColumnsCount)) {
          pIVar5 = (table->Columns).Data;
          uVar2 = pIVar30[1];
          if ((uVar2 & 1) != 0) {
            *(undefined4 *)((long)&pIVar5[(int)uVar42].WidthRequest + (ulong)(*pbVar39 & 8)) =
                 *(undefined4 *)(pbVar39 + -0xb);
            pIVar5[(int)uVar42].AutoFitQueue = '\0';
          }
          if ((uVar2 & 2) != 0) {
            uVar40 = (ulong)pbVar39[-2];
          }
          pIVar5[(int)uVar42].DisplayOrder = (ImGuiTableColumnIdx)uVar40;
          uVar38 = uVar38 | 1L << (uVar40 & 0x3f);
          bVar41 = (bool)(*pbVar39 >> 2 & 1);
          pIVar5[(int)uVar42].IsUserEnabledNextFrame = bVar41;
          pIVar5[(int)uVar42].IsUserEnabled = bVar41;
          pIVar5[(int)uVar42].SortOrder = pbVar39[-1];
          pIVar5[(int)uVar42].field_0x65 = pIVar5[(int)uVar42].field_0x65 & 0xfc | *pbVar39 & 3;
        }
        uVar36 = uVar36 + 1;
        bVar33 = (byte)pIVar30[3];
        pbVar39 = pbVar39 + 0xc;
      } while ((int)uVar36 < (int)(char)bVar33);
      uVar36 = (uint)(bVar33 == 0x40);
    }
    auVar28 = _DAT_00160440;
    uVar40 = ~(-1L << (bVar33 & 0x3f));
    if ((char)uVar36 != '\0') {
      uVar40 = 0xffffffffffffffff;
    }
    if (uVar38 != uVar40) {
      iVar3 = table->ColumnsCount;
      if (0 < (long)iVar3) {
        lVar37 = (long)iVar3 + -1;
        auVar43._8_4_ = (int)lVar37;
        auVar43._0_8_ = lVar37;
        auVar43._12_4_ = (int)((ulong)lVar37 >> 0x20);
        pIVar32 = &((table->Columns).Data)->DisplayOrder;
        uVar38 = 0;
        auVar44 = auVar43;
        auVar55 = _DAT_0016a460;
        auVar57 = _DAT_0016a470;
        auVar58 = _DAT_0016a480;
        auVar59 = _DAT_0016a490;
        auVar60 = _DAT_0016a4a0;
        auVar61 = _DAT_0016a4b0;
        auVar62 = _DAT_0016a4c0;
        auVar63 = _DAT_001639f0;
        do {
          auVar73 = auVar43 ^ auVar28;
          auVar77 = auVar63 ^ auVar28;
          iVar53 = auVar73._0_4_;
          iVar90 = -(uint)(iVar53 < auVar77._0_4_);
          iVar54 = auVar73._4_4_;
          auVar79._4_4_ = -(uint)(iVar54 < auVar77._4_4_);
          iVar75 = auVar73._8_4_;
          iVar94 = -(uint)(iVar75 < auVar77._8_4_);
          iVar76 = auVar73._12_4_;
          auVar79._12_4_ = -(uint)(iVar76 < auVar77._12_4_);
          auVar73._4_4_ = iVar90;
          auVar73._0_4_ = iVar90;
          auVar73._8_4_ = iVar94;
          auVar73._12_4_ = iVar94;
          auVar73 = pshuflw(auVar44,auVar73,0xe8);
          auVar78._4_4_ = -(uint)(auVar77._4_4_ == iVar54);
          auVar78._12_4_ = -(uint)(auVar77._12_4_ == iVar76);
          auVar78._0_4_ = auVar78._4_4_;
          auVar78._8_4_ = auVar78._12_4_;
          auVar64 = pshuflw(in_XMM11,auVar78,0xe8);
          auVar79._0_4_ = auVar79._4_4_;
          auVar79._8_4_ = auVar79._12_4_;
          auVar77 = pshuflw(auVar73,auVar79,0xe8);
          auVar44._8_4_ = 0xffffffff;
          auVar44._0_8_ = 0xffffffffffffffff;
          auVar44._12_4_ = 0xffffffff;
          auVar44 = (auVar77 | auVar64 & auVar73) ^ auVar44;
          auVar44 = packssdw(auVar44,auVar44);
          cVar35 = (char)uVar38;
          if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *pIVar32 = cVar35;
          }
          auVar64._4_4_ = iVar90;
          auVar64._0_4_ = iVar90;
          auVar64._8_4_ = iVar94;
          auVar64._12_4_ = iVar94;
          auVar79 = auVar78 & auVar64 | auVar79;
          auVar44 = packssdw(auVar79,auVar79);
          auVar77._8_4_ = 0xffffffff;
          auVar77._0_8_ = 0xffffffffffffffff;
          auVar77._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 ^ auVar77,auVar44 ^ auVar77);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44._0_4_ >> 8 & 1) != 0) {
            pIVar32[0x68] = cVar35 + '\x01';
          }
          auVar44 = auVar62 ^ auVar28;
          auVar65._0_4_ = -(uint)(iVar53 < auVar44._0_4_);
          auVar65._4_4_ = -(uint)(iVar54 < auVar44._4_4_);
          auVar65._8_4_ = -(uint)(iVar75 < auVar44._8_4_);
          auVar65._12_4_ = -(uint)(iVar76 < auVar44._12_4_);
          auVar80._4_4_ = auVar65._0_4_;
          auVar80._0_4_ = auVar65._0_4_;
          auVar80._8_4_ = auVar65._8_4_;
          auVar80._12_4_ = auVar65._8_4_;
          iVar90 = -(uint)(auVar44._4_4_ == iVar54);
          iVar94 = -(uint)(auVar44._12_4_ == iVar76);
          auVar15._4_4_ = iVar90;
          auVar15._0_4_ = iVar90;
          auVar15._8_4_ = iVar94;
          auVar15._12_4_ = iVar94;
          auVar91._4_4_ = auVar65._4_4_;
          auVar91._0_4_ = auVar65._4_4_;
          auVar91._8_4_ = auVar65._12_4_;
          auVar91._12_4_ = auVar65._12_4_;
          auVar44 = auVar15 & auVar80 | auVar91;
          auVar44 = packssdw(auVar44,auVar44);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 ^ auVar6,auVar44 ^ auVar6);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44._0_4_ >> 0x10 & 1) != 0) {
            pIVar32[0xd0] = cVar35 + '\x02';
          }
          auVar44 = pshufhw(auVar44,auVar80,0x84);
          auVar16._4_4_ = iVar90;
          auVar16._0_4_ = iVar90;
          auVar16._8_4_ = iVar94;
          auVar16._12_4_ = iVar94;
          auVar77 = pshufhw(auVar65,auVar16,0x84);
          auVar73 = pshufhw(auVar44,auVar91,0x84);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar45 = (auVar73 | auVar77 & auVar44) ^ auVar45;
          auVar44 = packssdw(auVar45,auVar45);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44._0_4_ >> 0x18 & 1) != 0) {
            pIVar32[0x138] = cVar35 + '\x03';
          }
          auVar44 = auVar61 ^ auVar28;
          auVar66._0_4_ = -(uint)(iVar53 < auVar44._0_4_);
          auVar66._4_4_ = -(uint)(iVar54 < auVar44._4_4_);
          auVar66._8_4_ = -(uint)(iVar75 < auVar44._8_4_);
          auVar66._12_4_ = -(uint)(iVar76 < auVar44._12_4_);
          auVar17._4_4_ = auVar66._0_4_;
          auVar17._0_4_ = auVar66._0_4_;
          auVar17._8_4_ = auVar66._8_4_;
          auVar17._12_4_ = auVar66._8_4_;
          auVar77 = pshuflw(auVar91,auVar17,0xe8);
          auVar46._0_4_ = -(uint)(auVar44._0_4_ == iVar53);
          auVar46._4_4_ = -(uint)(auVar44._4_4_ == iVar54);
          auVar46._8_4_ = -(uint)(auVar44._8_4_ == iVar75);
          auVar46._12_4_ = -(uint)(auVar44._12_4_ == iVar76);
          auVar81._4_4_ = auVar46._4_4_;
          auVar81._0_4_ = auVar46._4_4_;
          auVar81._8_4_ = auVar46._12_4_;
          auVar81._12_4_ = auVar46._12_4_;
          auVar44 = pshuflw(auVar46,auVar81,0xe8);
          auVar82._4_4_ = auVar66._4_4_;
          auVar82._0_4_ = auVar66._4_4_;
          auVar82._8_4_ = auVar66._12_4_;
          auVar82._12_4_ = auVar66._12_4_;
          auVar73 = pshuflw(auVar66,auVar82,0xe8);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 & auVar77,(auVar73 | auVar44 & auVar77) ^ auVar7);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pIVar32[0x1a0] = cVar35 + '\x04';
          }
          auVar18._4_4_ = auVar66._0_4_;
          auVar18._0_4_ = auVar66._0_4_;
          auVar18._8_4_ = auVar66._8_4_;
          auVar18._12_4_ = auVar66._8_4_;
          auVar82 = auVar81 & auVar18 | auVar82;
          auVar73 = packssdw(auVar82,auVar82);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44,auVar73 ^ auVar8);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44._4_2_ >> 8 & 1) != 0) {
            pIVar32[0x208] = cVar35 + '\x05';
          }
          auVar44 = auVar60 ^ auVar28;
          auVar67._0_4_ = -(uint)(iVar53 < auVar44._0_4_);
          auVar67._4_4_ = -(uint)(iVar54 < auVar44._4_4_);
          auVar67._8_4_ = -(uint)(iVar75 < auVar44._8_4_);
          auVar67._12_4_ = -(uint)(iVar76 < auVar44._12_4_);
          auVar83._4_4_ = auVar67._0_4_;
          auVar83._0_4_ = auVar67._0_4_;
          auVar83._8_4_ = auVar67._8_4_;
          auVar83._12_4_ = auVar67._8_4_;
          iVar90 = -(uint)(auVar44._4_4_ == iVar54);
          iVar94 = -(uint)(auVar44._12_4_ == iVar76);
          auVar19._4_4_ = iVar90;
          auVar19._0_4_ = iVar90;
          auVar19._8_4_ = iVar94;
          auVar19._12_4_ = iVar94;
          auVar92._4_4_ = auVar67._4_4_;
          auVar92._0_4_ = auVar67._4_4_;
          auVar92._8_4_ = auVar67._12_4_;
          auVar92._12_4_ = auVar67._12_4_;
          auVar44 = auVar19 & auVar83 | auVar92;
          auVar44 = packssdw(auVar44,auVar44);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 ^ auVar9,auVar44 ^ auVar9);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pIVar32[0x270] = cVar35 + '\x06';
          }
          auVar44 = pshufhw(auVar44,auVar83,0x84);
          auVar20._4_4_ = iVar90;
          auVar20._0_4_ = iVar90;
          auVar20._8_4_ = iVar94;
          auVar20._12_4_ = iVar94;
          auVar77 = pshufhw(auVar67,auVar20,0x84);
          auVar73 = pshufhw(auVar44,auVar92,0x84);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar47 = (auVar73 | auVar77 & auVar44) ^ auVar47;
          auVar44 = packssdw(auVar47,auVar47);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44._6_2_ >> 8 & 1) != 0) {
            pIVar32[0x2d8] = cVar35 + '\a';
          }
          auVar44 = auVar59 ^ auVar28;
          auVar68._0_4_ = -(uint)(iVar53 < auVar44._0_4_);
          auVar68._4_4_ = -(uint)(iVar54 < auVar44._4_4_);
          auVar68._8_4_ = -(uint)(iVar75 < auVar44._8_4_);
          auVar68._12_4_ = -(uint)(iVar76 < auVar44._12_4_);
          auVar21._4_4_ = auVar68._0_4_;
          auVar21._0_4_ = auVar68._0_4_;
          auVar21._8_4_ = auVar68._8_4_;
          auVar21._12_4_ = auVar68._8_4_;
          auVar77 = pshuflw(auVar92,auVar21,0xe8);
          auVar48._0_4_ = -(uint)(auVar44._0_4_ == iVar53);
          auVar48._4_4_ = -(uint)(auVar44._4_4_ == iVar54);
          auVar48._8_4_ = -(uint)(auVar44._8_4_ == iVar75);
          auVar48._12_4_ = -(uint)(auVar44._12_4_ == iVar76);
          auVar84._4_4_ = auVar48._4_4_;
          auVar84._0_4_ = auVar48._4_4_;
          auVar84._8_4_ = auVar48._12_4_;
          auVar84._12_4_ = auVar48._12_4_;
          auVar44 = pshuflw(auVar48,auVar84,0xe8);
          auVar85._4_4_ = auVar68._4_4_;
          auVar85._0_4_ = auVar68._4_4_;
          auVar85._8_4_ = auVar68._12_4_;
          auVar85._12_4_ = auVar68._12_4_;
          auVar73 = pshuflw(auVar68,auVar85,0xe8);
          auVar69._8_4_ = 0xffffffff;
          auVar69._0_8_ = 0xffffffffffffffff;
          auVar69._12_4_ = 0xffffffff;
          auVar69 = (auVar73 | auVar44 & auVar77) ^ auVar69;
          auVar73 = packssdw(auVar69,auVar69);
          auVar44 = packsswb(auVar44 & auVar77,auVar73);
          if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pIVar32[0x340] = cVar35 + '\b';
          }
          auVar22._4_4_ = auVar68._0_4_;
          auVar22._0_4_ = auVar68._0_4_;
          auVar22._8_4_ = auVar68._8_4_;
          auVar22._12_4_ = auVar68._8_4_;
          auVar85 = auVar84 & auVar22 | auVar85;
          auVar73 = packssdw(auVar85,auVar85);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar73 = packssdw(auVar73 ^ auVar10,auVar73 ^ auVar10);
          auVar44 = packsswb(auVar44,auVar73);
          if ((auVar44._8_2_ >> 8 & 1) != 0) {
            pIVar32[0x3a8] = cVar35 + '\t';
          }
          auVar44 = auVar58 ^ auVar28;
          auVar70._0_4_ = -(uint)(iVar53 < auVar44._0_4_);
          auVar70._4_4_ = -(uint)(iVar54 < auVar44._4_4_);
          auVar70._8_4_ = -(uint)(iVar75 < auVar44._8_4_);
          auVar70._12_4_ = -(uint)(iVar76 < auVar44._12_4_);
          auVar86._4_4_ = auVar70._0_4_;
          auVar86._0_4_ = auVar70._0_4_;
          auVar86._8_4_ = auVar70._8_4_;
          auVar86._12_4_ = auVar70._8_4_;
          iVar90 = -(uint)(auVar44._4_4_ == iVar54);
          iVar94 = -(uint)(auVar44._12_4_ == iVar76);
          auVar23._4_4_ = iVar90;
          auVar23._0_4_ = iVar90;
          auVar23._8_4_ = iVar94;
          auVar23._12_4_ = iVar94;
          auVar93._4_4_ = auVar70._4_4_;
          auVar93._0_4_ = auVar70._4_4_;
          auVar93._8_4_ = auVar70._12_4_;
          auVar93._12_4_ = auVar70._12_4_;
          auVar44 = auVar23 & auVar86 | auVar93;
          auVar44 = packssdw(auVar44,auVar44);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 ^ auVar11,auVar44 ^ auVar11);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pIVar32[0x410] = cVar35 + '\n';
          }
          auVar44 = pshufhw(auVar44,auVar86,0x84);
          auVar24._4_4_ = iVar90;
          auVar24._0_4_ = iVar90;
          auVar24._8_4_ = iVar94;
          auVar24._12_4_ = iVar94;
          auVar77 = pshufhw(auVar70,auVar24,0x84);
          auVar73 = pshufhw(auVar44,auVar93,0x84);
          auVar49._8_4_ = 0xffffffff;
          auVar49._0_8_ = 0xffffffffffffffff;
          auVar49._12_4_ = 0xffffffff;
          auVar49 = (auVar73 | auVar77 & auVar44) ^ auVar49;
          auVar44 = packssdw(auVar49,auVar49);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44._10_2_ >> 8 & 1) != 0) {
            pIVar32[0x478] = cVar35 + '\v';
          }
          auVar44 = auVar57 ^ auVar28;
          auVar71._0_4_ = -(uint)(iVar53 < auVar44._0_4_);
          auVar71._4_4_ = -(uint)(iVar54 < auVar44._4_4_);
          auVar71._8_4_ = -(uint)(iVar75 < auVar44._8_4_);
          auVar71._12_4_ = -(uint)(iVar76 < auVar44._12_4_);
          auVar25._4_4_ = auVar71._0_4_;
          auVar25._0_4_ = auVar71._0_4_;
          auVar25._8_4_ = auVar71._8_4_;
          auVar25._12_4_ = auVar71._8_4_;
          auVar77 = pshuflw(auVar93,auVar25,0xe8);
          auVar50._0_4_ = -(uint)(auVar44._0_4_ == iVar53);
          auVar50._4_4_ = -(uint)(auVar44._4_4_ == iVar54);
          auVar50._8_4_ = -(uint)(auVar44._8_4_ == iVar75);
          auVar50._12_4_ = -(uint)(auVar44._12_4_ == iVar76);
          auVar87._4_4_ = auVar50._4_4_;
          auVar87._0_4_ = auVar50._4_4_;
          auVar87._8_4_ = auVar50._12_4_;
          auVar87._12_4_ = auVar50._12_4_;
          auVar44 = pshuflw(auVar50,auVar87,0xe8);
          auVar88._4_4_ = auVar71._4_4_;
          auVar88._0_4_ = auVar71._4_4_;
          auVar88._8_4_ = auVar71._12_4_;
          auVar88._12_4_ = auVar71._12_4_;
          auVar73 = pshuflw(auVar71,auVar88,0xe8);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 & auVar77,(auVar73 | auVar44 & auVar77) ^ auVar12);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pIVar32[0x4e0] = cVar35 + '\f';
          }
          auVar26._4_4_ = auVar71._0_4_;
          auVar26._0_4_ = auVar71._0_4_;
          auVar26._8_4_ = auVar71._8_4_;
          auVar26._12_4_ = auVar71._8_4_;
          auVar88 = auVar87 & auVar26 | auVar88;
          auVar73 = packssdw(auVar88,auVar88);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44,auVar73 ^ auVar13);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44._12_2_ >> 8 & 1) != 0) {
            pIVar32[0x548] = cVar35 + '\r';
          }
          auVar44 = auVar55 ^ auVar28;
          auVar72._0_4_ = -(uint)(iVar53 < auVar44._0_4_);
          auVar72._4_4_ = -(uint)(iVar54 < auVar44._4_4_);
          auVar72._8_4_ = -(uint)(iVar75 < auVar44._8_4_);
          auVar72._12_4_ = -(uint)(iVar76 < auVar44._12_4_);
          auVar89._4_4_ = auVar72._0_4_;
          auVar89._0_4_ = auVar72._0_4_;
          auVar89._8_4_ = auVar72._8_4_;
          auVar89._12_4_ = auVar72._8_4_;
          iVar53 = -(uint)(auVar44._4_4_ == iVar54);
          iVar54 = -(uint)(auVar44._12_4_ == iVar76);
          auVar74._4_4_ = iVar53;
          auVar74._0_4_ = iVar53;
          auVar74._8_4_ = iVar54;
          auVar74._12_4_ = iVar54;
          auVar51._4_4_ = auVar72._4_4_;
          auVar51._0_4_ = auVar72._4_4_;
          auVar51._8_4_ = auVar72._12_4_;
          auVar51._12_4_ = auVar72._12_4_;
          auVar51 = auVar74 & auVar89 | auVar51;
          auVar44 = packssdw(auVar51,auVar51);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 ^ auVar14,auVar44 ^ auVar14);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pIVar32[0x5b0] = cVar35 + '\x0e';
          }
          auVar44 = pshufhw(auVar44,auVar89,0x84);
          auVar73 = pshufhw(auVar72,auVar74,0x84);
          in_XMM11 = auVar73 & auVar44;
          auVar27._4_4_ = auVar72._4_4_;
          auVar27._0_4_ = auVar72._4_4_;
          auVar27._8_4_ = auVar72._12_4_;
          auVar27._12_4_ = auVar72._12_4_;
          auVar44 = pshufhw(auVar44,auVar27,0x84);
          auVar52._8_4_ = 0xffffffff;
          auVar52._0_8_ = 0xffffffffffffffff;
          auVar52._12_4_ = 0xffffffff;
          auVar52 = (auVar44 | in_XMM11) ^ auVar52;
          auVar44 = packssdw(auVar52,auVar52);
          auVar44 = packsswb(auVar44,auVar44);
          if ((auVar44._14_2_ >> 8 & 1) != 0) {
            pIVar32[0x618] = cVar35 + '\x0f';
          }
          uVar38 = uVar38 + 0x10;
          lVar37 = (long)DAT_0016a4d0;
          lVar56 = auVar63._8_8_;
          auVar63._0_8_ = auVar63._0_8_ + lVar37;
          lVar34 = DAT_0016a4d0._8_8_;
          auVar63._8_8_ = lVar56 + lVar34;
          lVar56 = auVar62._8_8_;
          auVar62._0_8_ = auVar62._0_8_ + lVar37;
          auVar62._8_8_ = lVar56 + lVar34;
          lVar56 = auVar61._8_8_;
          auVar61._0_8_ = auVar61._0_8_ + lVar37;
          auVar61._8_8_ = lVar56 + lVar34;
          lVar56 = auVar60._8_8_;
          auVar60._0_8_ = auVar60._0_8_ + lVar37;
          auVar60._8_8_ = lVar56 + lVar34;
          lVar56 = auVar59._8_8_;
          auVar59._0_8_ = auVar59._0_8_ + lVar37;
          auVar59._8_8_ = lVar56 + lVar34;
          lVar56 = auVar58._8_8_;
          auVar58._0_8_ = auVar58._0_8_ + lVar37;
          auVar58._8_8_ = lVar56 + lVar34;
          lVar56 = auVar57._8_8_;
          auVar57._0_8_ = auVar57._0_8_ + lVar37;
          auVar57._8_8_ = lVar56 + lVar34;
          lVar56 = auVar55._8_8_;
          auVar55._0_8_ = auVar55._0_8_ + lVar37;
          auVar55._8_8_ = lVar56 + lVar34;
          pIVar32 = pIVar32 + 0x680;
          auVar44 = _DAT_0016a4d0;
        } while ((iVar3 + 0xfU & 0xfffffff0) != uVar38);
      }
    }
    if (0 < table->ColumnsCount) {
      lVar37 = 0x52;
      lVar34 = 0;
      do {
        (table->DisplayOrderToIndex).Data[*(char *)((long)&((table->Columns).Data)->Flags + lVar37)]
             = (char)lVar34;
        lVar34 = lVar34 + 1;
        lVar37 = lVar37 + 0x68;
      } while (lVar34 < table->ColumnsCount);
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    ImU64 display_order_mask = 0;
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        display_order_mask |= (ImU64)1 << column->DisplayOrder;
        column->IsUserEnabled = column->IsUserEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // Validate and fix invalid display order data
    const ImU64 expected_display_order_mask = (settings->ColumnsCount == 64) ? ~0 : ((ImU64)1 << settings->ColumnsCount) - 1;
    if (display_order_mask != expected_display_order_mask)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            table->Columns[column_n].DisplayOrder = (ImGuiTableColumnIdx)column_n;

    // Rebuild index
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}